

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strongly_connected_components.h
# Opt level: O1

bool __thiscall wasm::SCCs<IntIt,_GraphSCCs>::stepToNextGroup(SCCs<IntIt,_GraphSCCs> *this)

{
  unordered_map<unsigned_int,_wasm::SCCs<IntIt,_GraphSCCs>::ElementInfo,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_wasm::SCCs<IntIt,_GraphSCCs>::ElementInfo>_>_>
  *this_00;
  pointer *ppWVar1;
  pointer __args;
  key_type kVar2;
  iterator __position;
  iterator __position_00;
  pointer pWVar3;
  undefined8 uVar4;
  IntIt it;
  mapped_type *pmVar5;
  mapped_type *pmVar6;
  ulong uVar7;
  ulong uVar8;
  __hashtable *__h;
  pair<std::__detail::_Node_iterator<std::pair<const_unsigned_int,_wasm::SCCs<IntIt,_GraphSCCs>::ElementInfo>,_false,_false>,_bool>
  pVar9;
  WorkItem local_50;
  size_type local_40;
  undefined1 local_38;
  
  this_00 = &this->elementInfo;
  do {
    uVar4 = local_50._8_8_;
    kVar2 = (this->inputIt).i;
    if ((kVar2 == (this->inputEnd).i) &&
       ((this->workStack).
        super__Vector_base<wasm::SCCs<IntIt,_GraphSCCs>::WorkItem,_std::allocator<wasm::SCCs<IntIt,_GraphSCCs>::WorkItem>_>
        ._M_impl.super__Vector_impl_data._M_start ==
        (this->workStack).
        super__Vector_base<wasm::SCCs<IntIt,_GraphSCCs>::WorkItem,_std::allocator<wasm::SCCs<IntIt,_GraphSCCs>::WorkItem>_>
        ._M_impl.super__Vector_impl_data._M_finish)) {
      return false;
    }
    __position._M_current =
         (this->workStack).
         super__Vector_base<wasm::SCCs<IntIt,_GraphSCCs>::WorkItem,_std::allocator<wasm::SCCs<IntIt,_GraphSCCs>::WorkItem>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    if ((this->workStack).
        super__Vector_base<wasm::SCCs<IntIt,_GraphSCCs>::WorkItem,_std::allocator<wasm::SCCs<IntIt,_GraphSCCs>::WorkItem>_>
        ._M_impl.super__Vector_impl_data._M_start == __position._M_current) {
      (this->inputIt).i = kVar2 + 1;
      local_50.parent.super__Optional_base<unsigned_int,_true,_true>._M_payload.
      super__Optional_payload_base<unsigned_int>._4_4_ =
           local_50.parent.super__Optional_base<unsigned_int,_true,_true>._M_payload.
           super__Optional_payload_base<unsigned_int>._4_4_ & 0xffffff00;
      local_50._13_3_ = SUB83(uVar4,5);
      local_50.processedChildren = false;
      local_50.item = kVar2;
      if (__position._M_current ==
          (this->workStack).
          super__Vector_base<wasm::SCCs<IntIt,_GraphSCCs>::WorkItem,_std::allocator<wasm::SCCs<IntIt,_GraphSCCs>::WorkItem>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::
        vector<wasm::SCCs<IntIt,GraphSCCs>::WorkItem,std::allocator<wasm::SCCs<IntIt,GraphSCCs>::WorkItem>>
        ::_M_realloc_insert<wasm::SCCs<IntIt,GraphSCCs>::WorkItem>
                  ((vector<wasm::SCCs<IntIt,GraphSCCs>::WorkItem,std::allocator<wasm::SCCs<IntIt,GraphSCCs>::WorkItem>>
                    *)&this->workStack,__position,&local_50);
      }
      else {
        (__position._M_current)->item = kVar2;
        ((__position._M_current)->parent).super__Optional_base<unsigned_int,_true,_true>._M_payload.
        super__Optional_payload_base<unsigned_int>._M_payload =
             local_50.parent.super__Optional_base<unsigned_int,_true,_true>._M_payload.
             super__Optional_payload_base<unsigned_int>._M_payload;
        *(undefined8 *)
         &((__position._M_current)->parent).super__Optional_base<unsigned_int,_true,_true>.
          _M_payload.super__Optional_payload_base<unsigned_int>._M_engaged = local_50._8_8_;
        ppWVar1 = &(this->workStack).
                   super__Vector_base<wasm::SCCs<IntIt,_GraphSCCs>::WorkItem,_std::allocator<wasm::SCCs<IntIt,_GraphSCCs>::WorkItem>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        *ppWVar1 = *ppWVar1 + 1;
      }
    }
    while (pWVar3 = (this->workStack).
                    super__Vector_base<wasm::SCCs<IntIt,_GraphSCCs>::WorkItem,_std::allocator<wasm::SCCs<IntIt,_GraphSCCs>::WorkItem>_>
                    ._M_impl.super__Vector_impl_data._M_finish,
          (this->workStack).
          super__Vector_base<wasm::SCCs<IntIt,_GraphSCCs>::WorkItem,_std::allocator<wasm::SCCs<IntIt,_GraphSCCs>::WorkItem>_>
          ._M_impl.super__Vector_impl_data._M_start != pWVar3) {
      __args = pWVar3 + -1;
      if (pWVar3[-1].processedChildren == false) {
        local_50._8_8_ = (this->elementInfo)._M_h._M_element_count;
        local_50.item = __args->item;
        local_38 = 1;
        local_40 = local_50._8_8_;
        pVar9 = std::
                _Hashtable<unsigned_int,std::pair<unsigned_int_const,wasm::SCCs<IntIt,GraphSCCs>::ElementInfo>,std::allocator<std::pair<unsigned_int_const,wasm::SCCs<IntIt,GraphSCCs>::ElementInfo>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                ::_M_emplace<std::pair<unsigned_int_const,wasm::SCCs<IntIt,GraphSCCs>::ElementInfo>>
                          ((_Hashtable<unsigned_int,std::pair<unsigned_int_const,wasm::SCCs<IntIt,GraphSCCs>::ElementInfo>,std::allocator<std::pair<unsigned_int_const,wasm::SCCs<IntIt,GraphSCCs>::ElementInfo>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                            *)this_00,&local_50);
        if (((undefined1  [16])pVar9 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
          if (*(char *)((long)pVar9.first.
                              super__Node_iterator_base<std::pair<const_unsigned_int,_wasm::SCCs<IntIt,_GraphSCCs>::ElementInfo>,_false>
                              ._M_cur.
                              super__Node_iterator_base<std::pair<const_unsigned_int,_wasm::SCCs<IntIt,_GraphSCCs>::ElementInfo>,_false>
                       + 0x20) == '\x01') {
            if (pWVar3[-1].parent.super__Optional_base<unsigned_int,_true,_true>._M_payload.
                super__Optional_payload_base<unsigned_int>._M_engaged == false) {
              __assert_fail("work.parent",
                            "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/support/strongly_connected_components.h"
                            ,0x6e,
                            "bool wasm::SCCs<IntIt, GraphSCCs>::stepToNextGroup() [It = IntIt, Class = GraphSCCs]"
                           );
            }
            pmVar5 = std::__detail::
                     _Map_base<unsigned_int,_std::pair<const_unsigned_int,_wasm::SCCs<IntIt,_GraphSCCs>::ElementInfo>,_std::allocator<std::pair<const_unsigned_int,_wasm::SCCs<IntIt,_GraphSCCs>::ElementInfo>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                     ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_wasm::SCCs<IntIt,_GraphSCCs>::ElementInfo>,_std::allocator<std::pair<const_unsigned_int,_wasm::SCCs<IntIt,_GraphSCCs>::ElementInfo>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                   *)this_00,(key_type *)&pWVar3[-1].parent);
            uVar7 = *(ulong *)((long)pVar9.first.
                                     super__Node_iterator_base<std::pair<const_unsigned_int,_wasm::SCCs<IntIt,_GraphSCCs>::ElementInfo>,_false>
                                     ._M_cur.
                                     super__Node_iterator_base<std::pair<const_unsigned_int,_wasm::SCCs<IntIt,_GraphSCCs>::ElementInfo>,_false>
                              + 0x10);
            uVar8 = pmVar5->lowlink;
            if (uVar7 < pmVar5->lowlink) {
              uVar8 = uVar7;
            }
            pmVar5->lowlink = uVar8;
          }
          goto LAB_001c3d1d;
        }
        __position_00._M_current =
             (this->stack).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (__position_00._M_current ==
            (this->stack).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<unsigned_int,std::allocator<unsigned_int>>::
          _M_realloc_insert<unsigned_int_const&>
                    ((vector<unsigned_int,std::allocator<unsigned_int>> *)&this->stack,__position_00
                     ,&__args->item);
        }
        else {
          *__position_00._M_current = __args->item;
          (this->stack).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_finish = __position_00._M_current + 1;
        }
        pWVar3[-1].processedChildren = true;
        (this->currParent).super__Optional_base<unsigned_int,_true,_true>._M_payload.
        super__Optional_payload_base<unsigned_int> =
             (_Optional_payload_base<unsigned_int>)((ulong)pWVar3[-1].item | 0x100000000);
        GraphSCCs::pushChildren((GraphSCCs *)this,pWVar3[-1].item);
        if ((this->currParent).super__Optional_base<unsigned_int,_true,_true>._M_payload.
            super__Optional_payload_base<unsigned_int>._M_engaged == true) {
          (this->currParent).super__Optional_base<unsigned_int,_true,_true>._M_payload.
          super__Optional_payload_base<unsigned_int>._M_engaged = false;
        }
      }
      else {
        pmVar5 = std::__detail::
                 _Map_base<unsigned_int,_std::pair<const_unsigned_int,_wasm::SCCs<IntIt,_GraphSCCs>::ElementInfo>,_std::allocator<std::pair<const_unsigned_int,_wasm::SCCs<IntIt,_GraphSCCs>::ElementInfo>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                 ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_wasm::SCCs<IntIt,_GraphSCCs>::ElementInfo>,_std::allocator<std::pair<const_unsigned_int,_wasm::SCCs<IntIt,_GraphSCCs>::ElementInfo>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                               *)this_00,&__args->item);
        if (pWVar3[-1].parent.super__Optional_base<unsigned_int,_true,_true>._M_payload.
            super__Optional_payload_base<unsigned_int>._M_engaged == true) {
          pmVar6 = std::__detail::
                   _Map_base<unsigned_int,_std::pair<const_unsigned_int,_wasm::SCCs<IntIt,_GraphSCCs>::ElementInfo>,_std::allocator<std::pair<const_unsigned_int,_wasm::SCCs<IntIt,_GraphSCCs>::ElementInfo>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                   ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_wasm::SCCs<IntIt,_GraphSCCs>::ElementInfo>,_std::allocator<std::pair<const_unsigned_int,_wasm::SCCs<IntIt,_GraphSCCs>::ElementInfo>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                 *)this_00,(key_type *)&pWVar3[-1].parent);
          uVar7 = pmVar6->lowlink;
          if (pmVar5->lowlink < pmVar6->lowlink) {
            uVar7 = pmVar5->lowlink;
          }
          pmVar6->lowlink = uVar7;
        }
        if (pmVar5->index == pmVar5->lowlink) {
          (this->currRoot).super__Optional_base<unsigned_int,_true,_true>._M_payload.
          super__Optional_payload_base<unsigned_int> =
               (_Optional_payload_base<unsigned_int>)((ulong)__args->item | 0x100000000);
          ppWVar1 = &(this->workStack).
                     super__Vector_base<wasm::SCCs<IntIt,_GraphSCCs>::WorkItem,_std::allocator<wasm::SCCs<IntIt,_GraphSCCs>::WorkItem>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
          *ppWVar1 = *ppWVar1 + -1;
          return true;
        }
LAB_001c3d1d:
        ppWVar1 = &(this->workStack).
                   super__Vector_base<wasm::SCCs<IntIt,_GraphSCCs>::WorkItem,_std::allocator<wasm::SCCs<IntIt,_GraphSCCs>::WorkItem>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        *ppWVar1 = *ppWVar1 + -1;
      }
    }
  } while( true );
}

Assistant:

bool stepToNextGroup() {
    while (inputIt != inputEnd || !workStack.empty()) {
      if (workStack.empty()) {
        workStack.push_back({*inputIt++});
      }
      while (!workStack.empty()) {
        auto& work = workStack.back();
        auto& item = work.item;

        if (!work.processedChildren) {
          auto newIndex = elementInfo.size();
          auto [it, inserted] =
            elementInfo.insert({item, {newIndex, newIndex, true}});
          if (inserted) {
            // This is a new item we have never seen before. We have already
            // initialized its associated data.
            stack.push_back(item);

            // Leave the element on the work stack because we will have to do
            // more work after we have finished processing its children.
            work.processedChildren = true;
            currParent = item;
            static_cast<Class*>(this)->pushChildren(item);
            currParent = std::nullopt;
            // Process the pushed children first; we will come back to this item
            // later.
            continue;
          }

          auto& info = it->second;
          if (info.onStack) {
            assert(work.parent);
            // Item is already in the current SCC. Update the parent's lowlink
            // if this child has a smaller index than we have seen so far.
            auto& parentLowlink = elementInfo[*work.parent].lowlink;
            parentLowlink = std::min(parentLowlink, info.index);
          } else {
            // Item is in an SCC we have already processed, so ignore it
            // entirely.
          }
          // Do not recurse for this item we have seen before. We are done with
          // it.
          workStack.pop_back();
          continue;
        }

        // We have finished processing the children for the current element, so
        // we know its final lowlink value. Use it to potentially update the
        // parent's lowlink value.
        auto& info = elementInfo[item];
        if (work.parent) {
          auto& parentLowlink = elementInfo[*work.parent].lowlink;
          parentLowlink = std::min(parentLowlink, info.lowlink);
        }

        if (info.index == info.lowlink) {
          // This element reaches and is reachable by all shallower elements in
          // the stack (otherwise they would have already been popped) and does
          // not itself reach any deeper elements, so we have found an SCC and
          // the current item is its root.
          currRoot = item;
          workStack.pop_back();
          return true;
        }
        workStack.pop_back();
      }
    }
    // We are at the end.
    return false;
  }